

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_serialize.c
# Opt level: O1

char * serialize_wu124_(char *w,uint32_t v)

{
  if (v < 0x1fe0) {
    *w = (byte)(v - 0xe0 >> 8) | 0xe0;
    w[1] = (char)(v - 0xe0);
    return w + 2;
  }
  *w = -1;
  *(uint32_t *)(w + 1) = v;
  return w + 5;
}

Assistant:

static LJ_NOINLINE char *serialize_wu124_(char *w, uint32_t v)
{
  if (v < 0x1fe0) {
    v -= 0xe0;
    *w++ = (char)(0xe0 | (v >> 8)); *w++ = (char)v;
  } else {
    *w++ = (char)0xff;
#if LJ_BE
    v = lj_bswap(v);
#endif
    memcpy(w, &v, 4); w += 4;
  }
  return w;
}